

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::colSingletons(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  int iVar3;
  int p_col;
  int iVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  pointer pnVar12;
  long lVar13;
  int *piVar14;
  int iVar15;
  int *piVar16;
  long lVar17;
  int *piVar18;
  long lVar19;
  long lVar20;
  uint *puVar21;
  pointer pnVar22;
  int iVar23;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar24;
  undefined4 *puVar25;
  long lVar26;
  int iVar27;
  int *piVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  byte bVar33;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar33 = 0;
  iVar15 = (this->temp).stage;
  if (0 < iVar15) {
    piVar5 = (this->row).orig;
    piVar6 = (this->row).perm;
    piVar7 = (this->temp).s_mark;
    lVar26 = 0;
    piVar16 = (this->u).row.idx;
    do {
      iVar3 = piVar5[lVar26];
      lVar29 = (long)(this->u).row.len[iVar3];
      piVar18 = piVar16;
      if (0 < lVar29) {
        iVar15 = (this->u).row.start[iVar3];
        lVar32 = 0;
        do {
          p_col = piVar16[iVar15 + lVar32];
          piVar8 = (this->u).col.idx;
          piVar9 = (this->u).col.start;
          piVar10 = (this->u).col.len;
          piVar11 = (this->temp).s_cact;
          iVar27 = (piVar10[p_col] + piVar9[p_col]) - piVar11[p_col];
          piVar14 = piVar8 + iVar27;
          do {
            piVar28 = piVar14;
            piVar14 = piVar28 + 1;
          } while (*piVar28 != iVar3);
          *piVar28 = piVar8[iVar27];
          piVar8[iVar27] = iVar3;
          iVar27 = piVar11[p_col];
          piVar11[p_col] = iVar27 + -1;
          if (iVar27 == 2) {
            iVar27 = piVar10[p_col];
            piVar10[p_col] = iVar27 + -1;
            iVar27 = piVar8[(long)piVar9[p_col] + (long)iVar27 + -1];
            if (-1 < piVar6[iVar27]) goto LAB_0052a909;
            piVar8 = (this->u).row.len;
            iVar23 = piVar8[iVar27] + -1;
            iVar4 = (this->u).row.start[iVar27];
            piVar8[iVar27] = iVar23;
            lVar19 = (long)(iVar4 + iVar23);
            lVar17 = lVar19 * 0x80 + 0xf8;
            lVar30 = lVar19 * 4 + 4;
            do {
              lVar20 = lVar17;
              lVar31 = lVar30 + -4;
              lVar13 = lVar30 + -4;
              lVar17 = lVar20 + -0x80;
              lVar30 = lVar31;
            } while (*(int *)((long)piVar18 + lVar13) != p_col);
            iVar4 = (this->temp).stage;
            puVar1 = (undefined8 *)
                     ((long)(this->u).row.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                     lVar20);
            puVar21 = (uint *)(puVar1 + -0xf);
            pnVar24 = &local_b0;
            for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
              (pnVar24->m_backend).data._M_elems[0] = *puVar21;
              puVar21 = puVar21 + (ulong)bVar33 * -2 + 1;
              pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar24 + ((ulong)bVar33 * -2 + 1) * 4);
            }
            local_b0.m_backend.exp = *(int *)(puVar1 + -1);
            local_b0.m_backend.neg = *(bool *)((long)puVar1 + -4);
            local_b0.m_backend._120_8_ = *puVar1;
            setPivot(this,iVar4,p_col,iVar27,&local_b0);
            iVar27 = (this->temp).stage;
            (this->temp).stage = iVar27 + 1;
            piVar7[iVar27] = p_col;
            pnVar12 = (this->u).row.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar2 = (undefined4 *)((long)pnVar12[-2].m_backend.data._M_elems + lVar20 + 8);
            pnVar22 = pnVar12 + lVar19;
            puVar25 = puVar2;
            for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
              *puVar25 = (pnVar22->m_backend).data._M_elems[0];
              pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar33 * -2 + 1) * 4);
              puVar25 = puVar25 + (ulong)bVar33 * -2 + 1;
            }
            puVar2[0x1c] = pnVar12[lVar19].m_backend.exp;
            *(bool *)(puVar2 + 0x1d) = pnVar12[lVar19].m_backend.neg;
            *(undefined8 *)(puVar2 + 0x1e) = *(undefined8 *)&pnVar12[lVar19].m_backend.fpclass;
            piVar18 = (this->u).row.idx;
            *(int *)((long)piVar18 + lVar31) = piVar18[lVar19];
          }
          else if (iVar27 == 1) {
LAB_0052a909:
            this->stat = SINGULAR;
            return;
          }
          lVar32 = lVar32 + 1;
        } while (lVar32 != lVar29);
        iVar15 = (this->temp).stage;
      }
      lVar26 = lVar26 + 1;
      piVar16 = piVar18;
    } while (lVar26 < iVar15);
  }
  return;
}

Assistant:

void CLUFactor<R>::colSingletons()
{
   int i, j, k, n;
   int len;
   int p_col, p_row, newrow;
   int* idx;
   int* rorig = row.orig;
   int* rperm = row.perm;
   int* sing = temp.s_mark;


   /*  Iteratively update column counts due to removed column singletons
    *  thereby removing new arising columns singletons
    *  and computing the index of the first row singleton (-1)
    *  until no more can be found.
    */

   for(i = 0; i < temp.stage; ++i)
   {
      p_row = rorig[i];
      assert(p_row >= 0);
      idx = &(u.row.idx[u.row.start[p_row]]);
      len = u.row.len[p_row];

      for(j = 0; j < len; ++j)
      {
         /*  Move pivotal nonzeros to front of column.
          */
         p_col = idx[j];
         assert(temp.s_cact[p_col] > 0);

         n = u.col.start[p_col] + u.col.len[p_col] - temp.s_cact[p_col];

         for(k = n; u.col.idx[k] != p_row; ++k)
            ;

         assert(k < u.col.start[p_col] + u.col.len[p_col]);

         u.col.idx[k] = u.col.idx[n];

         u.col.idx[n] = p_row;

         n = --(temp.s_cact[p_col]);          /* column nonzeros of ACTIVE matrix */

         if(n == 1)                   /* Here is another singleton */
         {
            newrow = u.col.idx[--u.col.len[p_col] + u.col.start[p_col]];

            /*      Ensure, matrix not singular
             */

            if(rperm[newrow] >= 0)
            {
               this->stat = SLinSolver<R>::SINGULAR;
               return;
            }

            /*      Find singleton in row.
             */
            n = u.row.start[newrow] + (--(u.row.len[newrow]));

            for(k = n; u.row.idx[k] != p_col; --k)
               ;

            /*      Remove singleton from column.
             */
            setPivot(temp.stage, p_col, newrow, u.row.val[k]);

            sing[temp.stage++] = p_col;

            /*      Move pivot element to diag.
             */
            u.row.val[k] = u.row.val[n];

            u.row.idx[k] = u.row.idx[n];
         }
         else if(n == 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }
      }
   }

   assert(temp.stage <= thedim);
}